

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-sp3.c
# Opt level: O3

void coda_sp3_done(void)

{
  coda_type *type;
  long lVar1;
  void *__ptr;
  long lVar2;
  
  lVar1 = __tls_get_addr(&PTR_001d9d10);
  __ptr = *(void **)(lVar1 + 0x1120);
  if (__ptr != (void *)0x0) {
    lVar2 = 0;
    do {
      type = *(coda_type **)((long)__ptr + lVar2 * 8);
      if (type != (coda_type *)0x0) {
        coda_type_release(type);
        __ptr = *(void **)(lVar1 + 0x1120);
        *(undefined8 *)((long)__ptr + lVar2 * 8) = 0;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x4b);
    free(__ptr);
    *(long *)(lVar1 + 0x1120) = 0;
  }
  return;
}

Assistant:

void coda_sp3_done(void)
{
    int i;

    if (sp3_type == NULL)
    {
        return;
    }
    for (i = 0; i < num_sp3_types; i++)
    {
        if (sp3_type[i] != NULL)
        {
            coda_type_release(sp3_type[i]);
            sp3_type[i] = NULL;
        }
    }
    free(sp3_type);
    sp3_type = NULL;
}